

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryVaryingGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::geometry::anon_unknown_1::VaryingTest::initPrograms
          (VaryingTest *this,SourceCollections *sourceCollections)

{
  VertexOutputs VVar1;
  GeometryOutputs GVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  char *pcVar5;
  char *pcVar6;
  ostringstream src;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [40];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in highp vec4 a_position;\n");
  std::operator<<(poVar3,"layout(location = 1) in highp vec4 a_color;\n");
  VVar1 = (this->m_varyingTestSpec).vertexOutputs;
  if (VVar1 == VERTEXT_NO_OP) {
    poVar3 = std::operator<<((ostream *)local_190,"void main (void)\n");
    pcVar5 = "{\n";
  }
  else if (VVar1 == VERTEXT_ZERO) {
    poVar3 = std::operator<<((ostream *)local_190,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    pcVar5 = "\tgl_Position = a_position;\n";
  }
  else {
    if (VVar1 != VERTEXT_ONE) goto LAB_008a1319;
    poVar3 = std::operator<<((ostream *)local_190,"layout(location = 0) out highp vec4 v_geom_0;\n")
    ;
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\tgl_Position = a_position;\n");
    pcVar5 = "\tv_geom_0 = a_color;\n";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::operator<<(poVar3,"}\n");
LAB_008a1319:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"vertex",&local_1f9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar3 = std::operator<<(poVar3,"#extension GL_EXT_geometry_shader : require\n");
  poVar3 = std::operator<<(poVar3,"layout(triangles) in;\n");
  std::operator<<(poVar3,"layout(triangle_strip, max_vertices = 3) out;\n");
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_ONE) {
    std::operator<<((ostream *)local_190,"layout(location = 0) in highp vec4 v_geom_0[];\n");
  }
  if (0 < (int)(this->m_varyingTestSpec).geometryOutputs) {
    std::operator<<((ostream *)local_190,"layout(location = 0) out highp vec4 v_frag_0;\n");
    if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
      std::operator<<((ostream *)local_190,"layout(location = 1) out highp vec4 v_frag_1;\n");
    }
  }
  poVar3 = std::operator<<((ostream *)local_190,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\thighp vec4 offset = vec4(-0.2, -0.2, 0.0, 0.0);\n");
  poVar3 = std::operator<<(poVar3,"\thighp vec4 inputColor;\n");
  std::operator<<(poVar3,"\n");
  pcVar5 = "\tinputColor = v_geom_0[0];\n";
  pcVar6 = "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
  if ((this->m_varyingTestSpec).vertexOutputs != VERTEXT_ONE) {
    pcVar5 = "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
  }
  std::operator<<((ostream *)local_190,pcVar5);
  VVar1 = (this->m_varyingTestSpec).vertexOutputs;
  if (VVar1 == VERTEXT_NO_OP) {
    std::operator<<((ostream *)local_190,"\tgl_Position = vec4(0.0, 0.0, 0.0, 1.0) + offset;\n");
    VVar1 = (this->m_varyingTestSpec).vertexOutputs;
  }
  if (VERTEXT_NO_OP < VVar1) {
    std::operator<<((ostream *)local_190,"\tgl_Position = gl_in[0].gl_Position + offset;\n");
  }
  GVar2 = (this->m_varyingTestSpec).geometryOutputs;
  if (GVar2 == GEOMETRY_ONE) {
    std::operator<<((ostream *)local_190,"\tv_frag_0 = inputColor;\n");
    GVar2 = (this->m_varyingTestSpec).geometryOutputs;
  }
  if (GVar2 == GEOMETRY_TWO) {
    poVar3 = std::operator<<((ostream *)local_190,"\tv_frag_0 = inputColor * 0.5;\n");
    std::operator<<(poVar3,"\tv_frag_1 = inputColor.yxzw * 0.5;\n");
  }
  poVar3 = std::operator<<((ostream *)local_190,"\tEmitVertex();\n");
  std::operator<<(poVar3,"\n");
  pcVar5 = "\tinputColor = v_geom_0[1];\n";
  if ((this->m_varyingTestSpec).vertexOutputs != VERTEXT_ONE) {
    pcVar5 = "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
  }
  std::operator<<((ostream *)local_190,pcVar5);
  VVar1 = (this->m_varyingTestSpec).vertexOutputs;
  if (VVar1 == VERTEXT_NO_OP) {
    std::operator<<((ostream *)local_190,"\tgl_Position = vec4(1.0, 0.0, 0.0, 1.0) + offset;\n");
    VVar1 = (this->m_varyingTestSpec).vertexOutputs;
  }
  if (VERTEXT_NO_OP < VVar1) {
    std::operator<<((ostream *)local_190,"\tgl_Position = gl_in[1].gl_Position + offset;\n");
  }
  GVar2 = (this->m_varyingTestSpec).geometryOutputs;
  if (GVar2 == GEOMETRY_ONE) {
    std::operator<<((ostream *)local_190,"\tv_frag_0 = inputColor;\n");
    GVar2 = (this->m_varyingTestSpec).geometryOutputs;
  }
  if (GVar2 == GEOMETRY_TWO) {
    poVar3 = std::operator<<((ostream *)local_190,"\tv_frag_0 = inputColor * 0.5;\n");
    std::operator<<(poVar3,"\tv_frag_1 = inputColor.yxzw * 0.5;\n");
  }
  poVar3 = std::operator<<((ostream *)local_190,"\tEmitVertex();\n");
  std::operator<<(poVar3,"\n");
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_ONE) {
    pcVar6 = "\tinputColor = v_geom_0[2];\n";
  }
  std::operator<<((ostream *)local_190,pcVar6);
  VVar1 = (this->m_varyingTestSpec).vertexOutputs;
  if (VVar1 == VERTEXT_NO_OP) {
    std::operator<<((ostream *)local_190,"\tgl_Position = vec4(1.0, 1.0, 0.0, 1.0) + offset;\n");
    VVar1 = (this->m_varyingTestSpec).vertexOutputs;
  }
  if (VERTEXT_NO_OP < VVar1) {
    std::operator<<((ostream *)local_190,"\tgl_Position = gl_in[2].gl_Position + offset;\n");
  }
  GVar2 = (this->m_varyingTestSpec).geometryOutputs;
  if (GVar2 == GEOMETRY_ONE) {
    std::operator<<((ostream *)local_190,"\tv_frag_0 = inputColor;\n");
    GVar2 = (this->m_varyingTestSpec).geometryOutputs;
  }
  if (GVar2 == GEOMETRY_TWO) {
    poVar3 = std::operator<<((ostream *)local_190,"\tv_frag_0 = inputColor * 0.5;\n");
    std::operator<<(poVar3,"\tv_frag_1 = inputColor.yxzw * 0.5;\n");
  }
  poVar3 = std::operator<<((ostream *)local_190,"\tEmitVertex();\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\tEndPrimitive();\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"geometry",&local_1f9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  std::operator<<(poVar3,"layout(location = 0) out highp vec4 fragColor;\n");
  if (0 < (int)(this->m_varyingTestSpec).geometryOutputs) {
    std::operator<<((ostream *)local_190,"layout(location = 0) in highp vec4 v_frag_0;\n");
    if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
      std::operator<<((ostream *)local_190,"layout(location = 1) in highp vec4 v_frag_1;\n");
    }
  }
  poVar3 = std::operator<<((ostream *)local_190,"void main (void)\n");
  std::operator<<(poVar3,"{\n");
  GVar2 = (this->m_varyingTestSpec).geometryOutputs;
  if (GVar2 == GEOMETRY_ZERO) {
    std::operator<<((ostream *)local_190,"fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n");
    GVar2 = (this->m_varyingTestSpec).geometryOutputs;
  }
  if (GVar2 == GEOMETRY_ONE) {
    std::operator<<((ostream *)local_190,"\tfragColor = v_frag_0;\n");
    GVar2 = (this->m_varyingTestSpec).geometryOutputs;
  }
  if (GVar2 == GEOMETRY_TWO) {
    std::operator<<((ostream *)local_190,"\tfragColor = v_frag_0 + v_frag_1.yxzw;\n");
  }
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"fragment",&local_1f9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void VaryingTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) in highp vec4 a_position;\n"
			<<"layout(location = 1) in highp vec4 a_color;\n";
		switch(m_varyingTestSpec.vertexOutputs)
		{
			case VERTEXT_NO_OP:
				src	<< "void main (void)\n"
					<< "{\n"
					<< "}\n";
				break;
			case VERTEXT_ZERO:
				src	<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "}\n";
				break;
			case VERTEXT_ONE:
				src	<<"layout(location = 0) out highp vec4 v_geom_0;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "	v_geom_0 = a_color;\n"
					<< "}\n";
				break;
			default:
				DE_ASSERT(0);
		}
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "layout(location = 0) in highp vec4 v_geom_0[];\n";

		if (m_varyingTestSpec.geometryOutputs >= GEOMETRY_ONE)
			src	<< "layout(location = 0) out highp vec4 v_frag_0;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "layout(location = 1) out highp vec4 v_frag_1;\n";

		src	<< "void main (void)\n"
			<< "{\n"
			<< "	highp vec4 offset = vec4(-0.2, -0.2, 0.0, 0.0);\n"
			<< "	highp vec4 inputColor;\n"
			<< "\n";
		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "	inputColor = v_geom_0[0];\n";
		else
			src	<< "	inputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_NO_OP)
			src	<< "	gl_Position = vec4(0.0, 0.0, 0.0, 1.0) + offset;\n";
		if (m_varyingTestSpec.vertexOutputs >= VERTEXT_ZERO)
			src	<< "	gl_Position = gl_in[0].gl_Position + offset;\n";

		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<< "	v_frag_0 = inputColor;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "	v_frag_0 = inputColor * 0.5;\n"
				<< "	v_frag_1 = inputColor.yxzw * 0.5;\n";

		src	<< "	EmitVertex();\n"
			<< "\n";
		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "	inputColor = v_geom_0[1];\n";
		else
			src	<< "	inputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_NO_OP)
				src	<< "	gl_Position = vec4(1.0, 0.0, 0.0, 1.0) + offset;\n";
		if (m_varyingTestSpec.vertexOutputs >= VERTEXT_ZERO)
				src	<< "	gl_Position = gl_in[1].gl_Position + offset;\n";

		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<< "	v_frag_0 = inputColor;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "	v_frag_0 = inputColor * 0.5;\n"
				<< "	v_frag_1 = inputColor.yxzw * 0.5;\n";

		src	<< "	EmitVertex();\n"
			<< "\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "	inputColor = v_geom_0[2];\n";
		else
			src	<< "	inputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_NO_OP)
				src	<< "	gl_Position = vec4(1.0, 1.0, 0.0, 1.0) + offset;\n";
		if (m_varyingTestSpec.vertexOutputs >= VERTEXT_ZERO)
				src	<< "	gl_Position = gl_in[2].gl_Position + offset;\n";

		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<< "	v_frag_0 = inputColor;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "	v_frag_0 = inputColor * 0.5;\n"
				<< "	v_frag_1 = inputColor.yxzw * 0.5;\n";

		src	<< "	EmitVertex();\n"
			<< "\n"
			<< "	EndPrimitive();\n"
			<< "}\n";
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(src.str());
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) out highp vec4 fragColor;\n";
		if (m_varyingTestSpec.geometryOutputs >= GEOMETRY_ONE)
			src	<<"layout(location = 0) in highp vec4 v_frag_0;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<<"layout(location = 1) in highp vec4 v_frag_1;\n";

		src	<<"void main (void)\n"
			<<"{\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ZERO)
			src	<<"fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<<"	fragColor = v_frag_0;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<<"	fragColor = v_frag_0 + v_frag_1.yxzw;\n";
		src	<<"}\n";
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}